

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_radix_scatter.cpp
# Opt level: O2

void duckdb::RadixScatterStructVector
               (Vector *v,UnifiedVectorFormat *vdata,idx_t vcount,SelectionVector *sel,
               idx_t add_count,data_ptr_t *key_locations,bool desc,bool has_null,bool nulls_first,
               idx_t prefix_len,idx_t width,idx_t offset)

{
  sel_t *psVar1;
  bool bVar2;
  idx_t i_1;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  reference this_00;
  type v_00;
  SelectionVector *sel_00;
  idx_t iVar3;
  long lVar4;
  ulong uVar5;
  idx_t i;
  ulong uVar6;
  
  if (has_null) {
    width = width - 1;
    for (uVar6 = 0; add_count != uVar6; uVar6 = uVar6 + 1) {
      uVar5 = uVar6;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar5 = (ulong)sel->sel_vector[uVar6];
      }
      psVar1 = vdata->sel->sel_vector;
      if (psVar1 != (sel_t *)0x0) {
        uVar5 = (ulong)psVar1[uVar5];
      }
      bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,
                         uVar5 + offset);
      if (bVar2) {
        *key_locations[uVar6] = nulls_first;
      }
      else {
        *key_locations[uVar6] = !nulls_first;
        switchD_016d4fed::default(key_locations[uVar6] + 1,0,width);
      }
      key_locations[uVar6] = key_locations[uVar6] + 1;
    }
  }
  this = StructVector::GetEntries(v);
  this_00 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
            ::get<true>(this,0);
  v_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this_00);
  sel_00 = FlatVector::IncrementalSelectionVector();
  RowOperations::RadixScatter
            (v_00,vcount,sel_00,add_count,key_locations,false,true,false,prefix_len,width,offset);
  if (desc) {
    for (iVar3 = 0; lVar4 = -width, iVar3 != add_count; iVar3 = iVar3 + 1) {
      for (; lVar4 != 0; lVar4 = lVar4 + 1) {
        key_locations[iVar3][lVar4] = ~key_locations[iVar3][lVar4];
      }
    }
  }
  return;
}

Assistant:

void RadixScatterStructVector(Vector &v, UnifiedVectorFormat &vdata, idx_t vcount, const SelectionVector &sel,
                              idx_t add_count, data_ptr_t *key_locations, const bool desc, const bool has_null,
                              const bool nulls_first, const idx_t prefix_len, idx_t width, const idx_t offset) {
	// serialize null values
	if (has_null) {
		auto &validity = vdata.validity;
		const data_t valid = nulls_first ? 1 : 0;
		const data_t invalid = 1 - valid;

		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;

			// write validity and according value
			if (validity.RowIsValid(source_idx)) {
				key_locations[i][0] = valid;
			} else {
				key_locations[i][0] = invalid;
				memset(key_locations[i] + 1, '\0', width - 1);
			}
			key_locations[i]++;
		}
		width--;
	}
	// serialize the struct
	auto &child_vector = *StructVector::GetEntries(v)[0];
	RowOperations::RadixScatter(child_vector, vcount, *FlatVector::IncrementalSelectionVector(), add_count,
	                            key_locations, false, true, false, prefix_len, width, offset);
	// invert bits if desc
	if (desc) {
		for (idx_t i = 0; i < add_count; i++) {
			for (idx_t s = 0; s < width; s++) {
				*(key_locations[i] - width + s) = ~*(key_locations[i] - width + s);
			}
		}
	}
}